

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteBoothPartialProducts(FILE *pFile,int nVars)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Man_t *pGia;
  Mini_Aig_t *p;
  ulong uVar7;
  char *__format;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int local_4c;
  
  uVar7 = (ulong)(uint)nVars;
  pGia = Abc_GenSignedBooth(nVars,nVars);
  p = Gia_ManToMiniAig(pGia);
  Gia_ManStop(pGia);
  iVar4 = p->nSize;
  if (1 < (uint)nVars) {
    uVar7 = 0;
    uVar2 = nVars - 1;
    if (uVar2 != 0) {
      do {
        uVar7 = (ulong)((int)uVar7 + 1);
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  uVar10 = iVar4 / 2;
  uVar2 = nVars * 2;
  uVar11 = (ulong)uVar2;
  if (nVars != 0) {
    uVar11 = 0;
    uVar3 = uVar2 - 1;
    do {
      uVar11 = (ulong)((int)uVar11 + 1);
      bVar1 = 9 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar1);
  }
  uVar8 = (ulong)uVar10;
  if (1 < uVar10) {
    uVar8 = 0;
    uVar3 = uVar10 - 1;
    if (uVar3 != 0) {
      do {
        uVar8 = (ulong)((int)uVar8 + 1);
        bVar1 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar1);
    }
  }
  fprintf((FILE *)pFile,".names pp%0*d\n",uVar8,0);
  if (3 < iVar4) {
    uVar3 = 2;
    if (2 < (int)uVar10) {
      uVar3 = uVar10;
    }
    local_4c = 0;
    uVar9 = 0;
    do {
      uVar10 = (int)uVar9 + 1;
      iVar4 = Mini_AigNodeFanin0(p,uVar10);
      if (iVar4 == 0x7fffffff) {
        if (nVars < (int)uVar10) {
          if ((int)uVar2 < (int)uVar10) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                          ,0x430,"void Abc_WriteBoothPartialProducts(FILE *, int)");
          }
          uVar9 = (ulong)(uint)((int)uVar9 - nVars);
          __format = ".names b%0*d pp%0*d\n1 1\n";
        }
        else {
          __format = ".names a%0*d pp%0*d\n1 1\n";
        }
        fprintf((FILE *)pFile,__format,uVar7,uVar9,uVar8,(ulong)uVar10);
      }
      else {
        iVar4 = Mini_AigNodeFanin0(p,uVar10);
        if ((iVar4 == 0x7fffffff) || (iVar4 = Mini_AigNodeFanin1(p,uVar10), iVar4 != 0x7fffffff)) {
          iVar4 = Mini_AigNodeFanin0(p,uVar10);
          if ((iVar4 == 0x7fffffff) || (iVar4 = Mini_AigNodeFanin1(p,uVar10), iVar4 == 0x7fffffff))
          {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                          ,0x43f,"void Abc_WriteBoothPartialProducts(FILE *, int)");
          }
          uVar5 = Mini_AigNodeFanin0(p,uVar10);
          uVar6 = Mini_AigNodeFanin1(p,uVar10);
          if (((int)uVar5 < 0) || ((int)uVar6 < 0)) {
LAB_002d06c8:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          fprintf((FILE *)pFile,".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n",uVar8,(ulong)(uVar5 >> 1),
                  uVar8,(ulong)(uVar6 >> 1),uVar8,(ulong)uVar10,(ulong)(~uVar5 & 1),
                  (ulong)(~uVar6 & 1));
        }
        else {
          uVar5 = Mini_AigNodeFanin0(p,uVar10);
          if ((int)uVar5 < 0) goto LAB_002d06c8;
          fprintf((FILE *)pFile,".names pp%0*d y%0*d_%0*d\n%d 1\n",uVar8,(ulong)(uVar5 >> 1),uVar7,
                  (long)local_4c / (long)(int)uVar2 & 0xffffffff,uVar11,
                  (long)local_4c % (long)(int)uVar2 & 0xffffffff,(ulong)(~uVar5 & 1));
          local_4c = local_4c + 1;
        }
      }
      uVar9 = (ulong)uVar10;
    } while (uVar3 - 1 != uVar10);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  if (p == (Mini_Aig_t *)0x0) {
    return;
  }
  free(p);
  return;
}

Assistant:

void Abc_WriteBoothPartialProducts( FILE * pFile, int nVars )
{
    Mini_Aig_t * p = Abc_GenSignedBoothMini( nVars, nVars );
    int i, nNodes = Mini_AigNodeNum(p);
    int nDigits   = Abc_Base10Log( nVars );
    int nDigits2  = Abc_Base10Log( 2*nVars );
    int nDigits3  = Abc_Base10Log( nNodes );
    int nOut = 0;
    fprintf( pFile, ".names pp%0*d\n", nDigits3, 0 );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
        {
            if ( i > 0 && i <= nVars )
                fprintf( pFile, ".names a%0*d pp%0*d\n1 1\n", nDigits, i-1,       nDigits3, i );
            else if ( i > nVars && i <= 2*nVars )
                fprintf( pFile, ".names b%0*d pp%0*d\n1 1\n", nDigits, i-1-nVars, nDigits3, i );
            else assert( 0 );
        }
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            int Lit = Mini_AigNodeFanin0( p, i );
            fprintf( pFile, ".names pp%0*d y%0*d_%0*d\n%d 1\n", nDigits3, Abc_Lit2Var(Lit), nDigits, nOut/(2*nVars), nDigits2, nOut%(2*nVars), !Abc_LitIsCompl(Lit) );
            nOut++;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
        {
            int Lit0 = Mini_AigNodeFanin0( p, i );
            int Lit1 = Mini_AigNodeFanin1( p, i );
            fprintf( pFile, ".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n", 
                nDigits3, Abc_Lit2Var(Lit0), nDigits3, Abc_Lit2Var(Lit1), nDigits3, i, !Abc_LitIsCompl(Lit0), !Abc_LitIsCompl(Lit1) );
        }
        else assert( 0 );
    }
    Mini_AigStop( p );
}